

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>::format
          (short_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *__s;
  size_t sVar1;
  char *buf_ptr;
  scoped_padder p;
  scoped_padder sStack_48;
  
  if ((msg->source).line == 0) {
    scoped_padder::scoped_padder(&sStack_48,0,&(this->super_flag_formatter).padinfo_,dest);
  }
  else {
    __s = basename((msg->source).filename);
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar1 = strlen(__s);
    }
    else {
      sVar1 = 0;
    }
    scoped_padder::scoped_padder(&sStack_48,sVar1,&(this->super_flag_formatter).padinfo_,dest);
    sVar1 = strlen(__s);
    fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar1);
  }
  scoped_padder::~scoped_padder(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }